

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O1

LispPTR N_OP_fvar_(LispPTR tos,int n)

{
  DLword *achain;
  uint ptr;
  DLword *pDVar1;
  ulong uVar2;
  
  achain = MachineState.pvar + n;
  if ((*(ushort *)((ulong)achain ^ 2) & 1) != 0) {
    nnewframe((frameex1 *)(MachineState.pvar + -10),achain,
              *(int *)((long)MachineState.currentfunc +
                      ((((long)n & 0xfffffffffffffffeU) * 2 +
                       (ulong)(byte)*(ushort *)&(MachineState.currentfunc)->field_0xc * 2) -
                      (ulong)(*(ushort *)&(MachineState.currentfunc)->field_0xc >> 6 & 0xfffffffc)))
             );
  }
  pDVar1 = Lisp_world;
  uVar2 = (ulong)*(ushort *)((ulong)achain ^ 2) |
          (ulong)((*(ushort *)((ulong)(achain + 1) ^ 2) & 0xfff) << 0x10);
  if ((char)*(ushort *)((ulong)(achain + 1) ^ 2) != '\x01') {
    ptr = *(uint *)(Lisp_world + uVar2);
    if ((-1 < *(short *)((ulong)(ptr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(ptr,1);
      }
      else {
        htfind(ptr,1);
      }
    }
    if ((-1 < *(short *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(tos,0);
      }
      else {
        htfind(tos,0);
      }
    }
  }
  *(LispPTR *)(pDVar1 + uVar2) = tos;
  return tos;
}

Assistant:

LispPTR N_OP_fvar_(LispPTR tos, int n) {
  DLword *ppvar;    /* pointer to argued Fvar slot in pvar area */
  DLword *pfreeval; /* pointer to argued free value */

  ppvar = PVar + n;

  if (WBITSPTR(ppvar)->LSB) /* check unbound ? */
  {                         /* unbound */
    nfvlookup(CURRENTFX, ppvar, FuncObj);
  }

  pfreeval = NativeAligned2FromLAddr(MaskShift((GETWORD(ppvar + 1))) | GETWORD(ppvar));

  if (((0xFF & GETWORD(ppvar + 1)) != STK_HI)) {
    GCLOOKUP(*((LispPTR *)pfreeval), DELREF);
    GCLOOKUP(tos, ADDREF);
  }

  *((LispPTR *)pfreeval) = tos;
  return (tos);
}